

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O3

void __thiscall
cppnet::Any::
CHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~CHolder
          (CHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer pcVar1;
  
  (this->super_CPlaceHolder)._vptr_CPlaceHolder = (_func_int **)&PTR__CHolder_00132aa0;
  pcVar1 = (this->_held)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_held).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

CHolder(const ValueType& value) : _held(value) {
        }